

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

cf_int_t cf_array_find(cf_array_t *self,cf_void_t *elm,cf_size_t size,cf_alg_equal_f cmp)

{
  cf_bool_t cVar1;
  ulong uVar2;
  
  if ((self->elm_count != 0) && (self->elm_count != 0)) {
    uVar2 = 0;
    do {
      cVar1 = (*cmp)(elm,(cf_void_t *)(self->elm_size * uVar2 + (long)self->elm_start));
      if (cVar1 != 0) {
        return (cf_int_t)uVar2;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < self->elm_count);
  }
  return 0x7fffffff;
}

Assistant:

cf_int_t cf_array_find(cf_array_t* self, cf_void_t* elm, cf_size_t size, cf_alg_equal_f cmp) {
    cf_size_t i;
    if (self->elm_count <= 0) {
        return CF_ARRAY_INVALID_INDEX;
    }
    for (i = 0; i < self->elm_count; i++) {
        if (cmp(elm, (cf_uint8_t*)self->elm_start + self->elm_size * i)) {
            return i;
        }
    }

    return CF_ARRAY_INVALID_INDEX;
}